

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBooleanResult::~IfcBooleanResult(IfcBooleanResult *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  p_Var2 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcBooleanResult_008df1e0;
  *(undefined ***)(&this->field_0x70 + (long)p_Var2) = &PTR__IfcBooleanResult_008df258;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = &PTR__IfcBooleanResult_008df208;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = &PTR__IfcBooleanResult_008df230;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->SecondOperand).
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + (long)p_Var2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58));
  }
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  operator_delete(p_Var1,0x88);
  return;
}

Assistant:

IfcBooleanResult() : Object("IfcBooleanResult") {}